

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_hooktask.cc
# Opt level: O3

void HookTask::initialize(search *sch,size_t *num_actions,options_i *param_3)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0x60);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[0xb] = *num_actions;
  sch->task_data = puVar1;
  return;
}

Assistant:

void initialize(Search::search& sch, size_t& num_actions, options_i&)
{
  task_data* td = new task_data;
  td->run_f = nullptr;
  td->run_setup_f = nullptr;
  td->run_takedown_f = nullptr;
  td->run_object = nullptr;
  td->setup_object = nullptr;
  td->takedown_object = nullptr;
  td->delete_run_object = nullptr;
  td->delete_extra_data = nullptr;
  td->num_actions = num_actions;
  sch.set_task_data<task_data>(td);
}